

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O2

void test_dual_storage_with_tuple_init_state_mutation(void)

{
  bool bVar1;
  reference_type pDVar2;
  DateInterval local_38;
  DateInterval local_30;
  DateInterval i12;
  opt_interval o1;
  opt_interval o2;
  
  DateInterval_value_ctor_calls_count = 0;
  DateInterval_copy_ctor_calls_count = 0;
  DateInterval_move_ctor_calls_count = 0;
  DateInterval_dtor_calls_count = 0;
  i12._first._d = 1;
  o1._storage.value_._value._first._d = (Date)2;
  DateInterval::DateInterval(&local_30,&i12._first,(Date *)&o1);
  bVar1 = count_Interval_value_copy_move_dtror(1,0,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 0, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x394,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  i12._first._d = 2;
  i12._last._d = 1;
  DateInterval::DateInterval((DateInterval *)&o1,&local_30);
  bVar1 = count_Interval_value_copy_move_dtror(1,1,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 1, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x397,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  if ((int)o1._storage.value_._value._last._d < (int)o1._storage.value_._value._first._d) {
    __assert_fail("o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39a,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  DateInterval::DateInterval(&local_38,&local_30);
  ak_toolkit::markable_ns::dual_storage<mark_interval>::operator=
            ((dual_storage<mark_interval> *)&i12,(dual_storage<mark_interval> *)&local_38);
  ak_toolkit::markable_ns::dual_storage<mark_interval>::~dual_storage
            ((dual_storage<mark_interval> *)&local_38);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,1,1);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 1, 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39d,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  local_38._first._d = 2;
  local_38._last._d = 1;
  ak_toolkit::markable_ns::dual_storage<mark_interval>::operator=
            (&o1._storage,(dual_storage<mark_interval> *)&local_38);
  ak_toolkit::markable_ns::dual_storage<mark_interval>::~dual_storage
            ((dual_storage<mark_interval> *)&local_38);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,1,2);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 1, 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39f,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  if (i12._last._d < i12._first._d) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a1,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  pDVar2 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
           value((markable<mark_interval,_ak_toolkit::markable_ns::order_none> *)&i12);
  if (((pDVar2->_first)._d != local_30._first._d) || ((pDVar2->_last)._d != local_30._last._d)) {
    __assert_fail("o1.value() == i12",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a2,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  if ((int)o1._storage.value_._value._first._d <= (int)o1._storage.value_._value._last._d) {
    __assert_fail("!o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a3,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::dual_storage<mark_interval>::swap_impl
            ((dual_storage<mark_interval> *)&i12,&o1._storage);
  bVar1 = count_Interval_value_copy_move_dtror(1,2,2,3);
  if (bVar1) {
    if (i12._first._d <= i12._last._d) {
      __assert_fail("!o1.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x3a8,"void test_dual_storage_with_tuple_init_state_mutation()");
    }
    if ((int)o1._storage.value_._value._first._d <= (int)o1._storage.value_._value._last._d) {
      pDVar2 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>
               ::value(&o1);
      if (((pDVar2->_first)._d == local_30._first._d) && ((pDVar2->_last)._d == local_30._last._d))
      {
        ak_toolkit::markable_ns::dual_storage<mark_interval>::~dual_storage(&o1._storage);
        ak_toolkit::markable_ns::dual_storage<mark_interval>::~dual_storage
                  ((dual_storage<mark_interval> *)&i12);
        DateInterval::~DateInterval(&local_30);
        bVar1 = count_Interval_value_copy_move_dtror(1,2,2,5);
        if (bVar1) {
          return;
        }
        __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 2, 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                      ,0x3ac,"void test_dual_storage_with_tuple_init_state_mutation()");
      }
      __assert_fail("o2.value() == i12",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x3aa,"void test_dual_storage_with_tuple_init_state_mutation()");
    }
    __assert_fail("o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a9,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 2, 3)",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x3a6,"void test_dual_storage_with_tuple_init_state_mutation()");
}

Assistant:

void test_dual_storage_with_tuple_init_state_mutation()
{
  reset_Interval_count();
  {
    typedef markable<mark_interval> opt_interval;
    DateInterval i12 {Date{1}, Date{2}};
    assert (count_Interval_value_copy_move_dtror(1, 0, 0, 0));

    opt_interval o1 {}, o2 {i12};
    assert (count_Interval_value_copy_move_dtror(1, 1, 0, 0));

    assert (!o1.has_value());
    assert (o2.has_value());

    o1 = opt_interval{i12};
    assert (count_Interval_value_copy_move_dtror(1, 2, 1, 1));
    o2 = {};
    assert (count_Interval_value_copy_move_dtror(1, 2, 1, 2));

    assert (o1.has_value());
    assert (o1.value() == i12);
    assert (!o2.has_value());

    swap (o1, o2);
    assert (count_Interval_value_copy_move_dtror(1, 2, 2, 3));

    assert (!o1.has_value());
    assert (o2.has_value());
    assert (o2.value() == i12);
  }
  assert (count_Interval_value_copy_move_dtror(1, 2, 2, 5));
}